

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SVM.pb.cc
# Opt level: O1

size_t __thiscall CoreML::Specification::SigmoidKernel::ByteSizeLong(SigmoidKernel *this)

{
  size_t sVar1;
  size_t sVar2;
  ulong uVar3;
  
  uVar3 = (ulong)(-(uint)(this->gamma_ != 0.0) & 1);
  sVar1 = uVar3 * 9 + 9;
  sVar2 = uVar3 * 9;
  if (this->c_ != 0.0) {
    sVar2 = sVar1;
  }
  if (NAN(this->c_)) {
    sVar2 = sVar1;
  }
  this->_cached_size_ = (int)sVar2;
  return sVar2;
}

Assistant:

size_t SigmoidKernel::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.SigmoidKernel)
  size_t total_size = 0;

  // double gamma = 1;
  if (this->gamma() != 0) {
    total_size += 1 + 8;
  }

  // double c = 2;
  if (this->c() != 0) {
    total_size += 1 + 8;
  }

  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}